

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btSoftBody.cpp
# Opt level: O2

btScalar btSoftBody::RayFromToCaster::rayFromToTriangle
                   (btVector3 *rayFrom,btVector3 *rayTo,btVector3 *rayNormalizedDirection,
                   btVector3 *a,btVector3 *b,btVector3 *c,btScalar maxt)

{
  float fVar1;
  float fVar2;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dd;
  float fVar3;
  undefined4 in_XMM1_Dc;
  undefined4 in_XMM1_Dd;
  btVector3 bVar4;
  btScalar t;
  btVector3 hit;
  btScalar local_d0;
  btScalar local_cc;
  undefined1 local_c8 [16];
  undefined1 local_b8 [16];
  btVector3 local_a0;
  btVector3 local_90;
  btVector3 local_80;
  btVector3 local_70;
  btVector3 local_60;
  btVector3 local_50;
  btVector3 local_40;
  
  local_cc = maxt;
  local_a0 = operator-(b,a);
  local_90 = operator-(c,a);
  bVar4 = btVector3::cross(&local_a0,&local_90);
  fVar3 = bVar4.m_floats[2];
  fVar1 = bVar4.m_floats[0];
  fVar2 = bVar4.m_floats[1];
  local_d0 = rayNormalizedDirection->m_floats[2] * fVar3 +
             rayNormalizedDirection->m_floats[0] * fVar1 +
             rayNormalizedDirection->m_floats[1] * fVar2;
  if (((1.1920929e-07 <= ABS(local_d0)) &&
      (local_d0 = -((fVar3 * rayFrom->m_floats[2] +
                    fVar1 * rayFrom->m_floats[0] + fVar2 * rayFrom->m_floats[1]) -
                   (fVar3 * a->m_floats[2] + fVar1 * a->m_floats[0] + fVar2 * a->m_floats[1])) /
                  local_d0, 1.1920929e-06 < local_d0)) && (local_d0 < local_cc)) {
    local_b8._8_4_ = in_XMM1_Dc;
    local_b8._0_8_ = bVar4.m_floats._8_8_;
    local_b8._12_4_ = in_XMM1_Dd;
    local_c8._8_4_ = extraout_XMM0_Dc;
    local_c8._0_8_ = bVar4.m_floats._0_8_;
    local_c8._12_4_ = extraout_XMM0_Dd;
    local_90 = operator*(rayNormalizedDirection,&local_d0);
    local_a0 = operator+(rayFrom,&local_90);
    local_90 = operator-(a,&local_a0);
    local_40 = operator-(b,&local_a0);
    bVar4 = btVector3::cross(&local_90,&local_40);
    if (-1.1920929e-06 <
        bVar4.m_floats[2] * (float)local_b8._0_4_ +
        bVar4.m_floats[0] * (float)local_c8._0_4_ + (float)local_c8._4_4_ * bVar4.m_floats[1]) {
      local_50 = operator-(b,&local_a0);
      local_60 = operator-(c,&local_a0);
      bVar4 = btVector3::cross(&local_50,&local_60);
      if (-1.1920929e-06 <
          bVar4.m_floats[2] * (float)local_b8._0_4_ +
          bVar4.m_floats[0] * (float)local_c8._0_4_ + (float)local_c8._4_4_ * bVar4.m_floats[1]) {
        local_70 = operator-(c,&local_a0);
        local_80 = operator-(a,&local_a0);
        bVar4 = btVector3::cross(&local_70,&local_80);
        if (-1.1920929e-06 <
            bVar4.m_floats[2] * (float)local_b8._0_4_ +
            bVar4.m_floats[0] * (float)local_c8._0_4_ + (float)local_c8._4_4_ * bVar4.m_floats[1]) {
          return local_d0;
        }
        return -1.0;
      }
    }
  }
  return -1.0;
}

Assistant:

btScalar			btSoftBody::RayFromToCaster::rayFromToTriangle(	const btVector3& rayFrom,
																   const btVector3& rayTo,
																   const btVector3& rayNormalizedDirection,
																   const btVector3& a,
																   const btVector3& b,
																   const btVector3& c,
																   btScalar maxt)
{
	static const btScalar	ceps=-SIMD_EPSILON*10;
	static const btScalar	teps=SIMD_EPSILON*10;

	const btVector3			n=btCross(b-a,c-a);
	const btScalar			d=btDot(a,n);
	const btScalar			den=btDot(rayNormalizedDirection,n);
	if(!btFuzzyZero(den))
	{
		const btScalar		num=btDot(rayFrom,n)-d;
		const btScalar		t=-num/den;
		if((t>teps)&&(t<maxt))
		{
			const btVector3	hit=rayFrom+rayNormalizedDirection*t;
			if(	(btDot(n,btCross(a-hit,b-hit))>ceps)	&&			
				(btDot(n,btCross(b-hit,c-hit))>ceps)	&&
				(btDot(n,btCross(c-hit,a-hit))>ceps))
			{
				return(t);
			}
		}
	}
	return(-1);
}